

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdDtol(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  ctx->vmState->x86DtolWrap = x86DtolWrap;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_cvttsd2si64,rEAX,sQWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,cmd._0_4_ >> 5 & 0x7f8,rEAX);
  return;
}

Assistant:

void GenCodeCmdDtol(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	ctx.vmState->x86DtolWrap = x86DtolWrap;

#if defined(_M_X64)
	EMIT_OP_REG_RPTR(ctx.ctx, o_cvttsd2si64, rRAX, sQWORD, rREG, cmd.rC * 8); // Load double as long
	EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, rRAX); // Store value
#else
	EMIT_OP_NUM(ctx.ctx, o_push, (cmd.rA << 8) | cmd.rC);
	EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->x86DtolWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 8);
#endif
}